

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall
DCanvas::FlatFill(DCanvas *this,int left,int top,int right,int bottom,FTexture *src,bool param_6)

{
  int iVar1;
  int iVar2;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_3c;
  undefined4 local_38;
  int x;
  int y;
  int h;
  int w;
  bool local_origin_local;
  FTexture *src_local;
  int bottom_local;
  int right_local;
  int top_local;
  int left_local;
  DCanvas *this_local;
  
  iVar1 = FTexture::GetWidth(src);
  iVar2 = FTexture::GetHeight(src);
  local_4c = top;
  if (!param_6) {
    local_4c = (top / iVar2) * iVar2;
  }
  for (local_38 = local_4c; local_38 < bottom; local_38 = iVar2 + local_38) {
    local_50 = left;
    if (!param_6) {
      local_50 = (left / iVar1) * iVar1;
    }
    for (local_3c = local_50; local_3c < right; local_3c = iVar1 + local_3c) {
      DrawTexture(this,src,(double)local_3c,(double)local_38,0x400013a3,(ulong)(uint)left,0x400013a4
                  ,(ulong)(uint)right,0x400013a1,top,0x400013a2,bottom,0x4000139b,0,0x4000139c,0,0);
    }
  }
  return;
}

Assistant:

void DCanvas::FlatFill (int left, int top, int right, int bottom, FTexture *src, bool local_origin)
{
	int w = src->GetWidth();
	int h = src->GetHeight();

	// Repeatedly draw the texture, left-to-right, top-to-bottom.
	for (int y = local_origin ? top : (top / h * h); y < bottom; y += h)
	{
		for (int x = local_origin ? left : (left / w * w); x < right; x += w)
		{
			DrawTexture (src, x, y,
				DTA_ClipLeft, left,
				DTA_ClipRight, right,
				DTA_ClipTop, top,
				DTA_ClipBottom, bottom,
				DTA_TopOffset, 0,
				DTA_LeftOffset, 0,
				TAG_DONE);
		}
	}
}